

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O2

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextBlock
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  allocator_type local_31;
  vector<char,std::allocator<char>> local_30 [24];
  
  if (this->m_cachePos == 0) {
    bVar1 = readNextBlock(this);
    if (!bVar1) {
      return false;
    }
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (local_30,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_31);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(buffer,local_30);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_30);
  }
  else {
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (local_30,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        ((this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + this->m_cachePos),
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_31);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(buffer,local_30);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_30);
    this->m_cachePos = 0;
  }
  return true;
}

Assistant:

inline
bool IOStreamBuffer<T>::getNextBlock( std::vector<T> &buffer) {
    // Return the last block-value if getNextLine was used before
    if ( 0 != m_cachePos ) {      
        buffer = std::vector<T>( m_cache.begin() + m_cachePos, m_cache.end() );
        m_cachePos = 0;
    } else {
        if ( !readNextBlock() ) {
            return false;
        }

        buffer = std::vector<T>(m_cache.begin(), m_cache.end());
    }

    return true;
}